

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BasicBlock * __thiscall
FlowGraph::InsertAirlockBlock(FlowGraph *this,FlowEdge *edge,bool afterForward)

{
  uint num;
  Func *func;
  code *pcVar1;
  bool bVar2;
  BasicBlock *this_00;
  BasicBlock *pBVar3;
  BasicBlock *block;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar4;
  Type *ppFVar5;
  BasicBlock *pBVar6;
  Instr *pIVar7;
  LabelInstr *pLVar8;
  BranchInstr *pBVar9;
  Instr *this_02;
  LabelInstr *this_03;
  Region *region;
  MultiBranchInstr *this_04;
  LabelInstr *pLVar10;
  FlowEdge *pFVar11;
  BasicBlock *compensationBlock;
  FlowEdge *dstEdge;
  bool replaced;
  BranchInstr *sourceBr;
  BranchInstr *airlockBr;
  LabelInstr *airlockLabel;
  Func *sinkLabelFunc;
  LabelInstr *sinkLabel;
  Instr *sinkPrevBlockLastInstr;
  BasicBlock *sinkPrevBlock;
  FlowEdge *onlyLink;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *successors;
  Instr *sourceLastInstr;
  BasicBlock *sinkBlock;
  BasicBlock *sourceBlock;
  BasicBlock *airlockBlock;
  bool afterForward_local;
  FlowEdge *edge_local;
  FlowGraph *this_local;
  
  this_00 = BasicBlock::New(this);
  pBVar3 = FlowEdge::GetPred(edge);
  block = FlowEdge::GetSucc(edge);
  successors = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
               BasicBlock::GetLastInstr(pBVar3);
  bVar2 = IR::Instr::IsBranchInstr((Instr *)successors);
  if (!bVar2) {
    this_01 = &BasicBlock::GetSuccList(pBVar3)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(this_01);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x87e,"(successors->HasOne())",
                         "Failed to normalize weird block before airlock");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head(this_01);
    pFVar11 = *ppFVar5;
    if (pFVar11 != edge) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x880,"(onlyLink == edge)","Found duplicate of edge?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pBVar6 = FlowEdge::GetSucc(pFVar11);
    if (pBVar6 != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x881,"(onlyLink->GetSucc() == sinkBlock)","State inconsistent");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pBVar6 = FlowEdge::GetSucc(pFVar11);
    pIVar7 = BasicBlock::GetFirstInstr(pBVar6);
    pLVar8 = IR::Instr::AsLabelInstr(pIVar7);
    pBVar9 = IR::BranchInstr::New(Br,pLVar8,((Instr *)successors)->m_func);
    IR::Instr::InsertAfter((Instr *)successors,&pBVar9->super_Instr);
    successors = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
                 ((Instr *)successors)->m_next;
  }
  pBVar6 = block->prev;
  pIVar7 = BasicBlock::GetLastInstr(pBVar6);
  this_00->loop = block->loop;
  num = this->blockCount;
  this->blockCount = num + 1;
  BasicBlock::SetBlockNum(this_00,num);
  *(ushort *)&this_00->field_0x18 = *(ushort *)&this_00->field_0x18 & 0xfdff | 0x200;
  this_00->prev = block->prev;
  block->prev = this_00;
  this_00->next = block;
  this_00->prev->next = this_00;
  BasicBlock::RemoveSucc(pBVar3,block,this,false,false);
  AddEdge(this,pBVar3,this_00);
  FlowEdge::SetPred(edge,this_00);
  BasicBlock::AddSucc(this_00,edge,this);
  BasicBlock::SetDataUseCount(this_00,1);
  BasicBlock::DecrementDataUseCount(pBVar3);
  this_02 = BasicBlock::GetFirstInstr(block);
  pLVar8 = IR::Instr::AsLabelInstr(this_02);
  func = (pLVar8->super_Instr).m_func;
  this_03 = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(pIVar7,&this_03->super_Instr);
  BasicBlock::SetFirstInstr(this_00,&this_03->super_Instr);
  IR::LabelInstr::SetBasicBlock(this_03,this_00);
  pBVar9 = IR::BranchInstr::New(Br,pLVar8,func);
  IR::Instr::SetByteCodeOffset(&pBVar9->super_Instr,&pLVar8->super_Instr);
  IR::Instr::InsertAfter(&this_03->super_Instr,&pBVar9->super_Instr);
  BasicBlock::SetLastInstr(this_00,&pBVar9->super_Instr);
  IR::Instr::SetByteCodeOffset(&this_03->super_Instr,&pLVar8->super_Instr);
  if (afterForward) {
    region = IR::LabelInstr::GetRegion(pLVar8);
    IR::LabelInstr::SetRegion(this_03,region);
  }
  pBVar9 = IR::Instr::AsBranchInstr((Instr *)successors);
  bVar2 = IR::BranchInstr::IsMultiBranch(pBVar9);
  if (bVar2) {
    this_04 = IR::BranchInstr::AsMultiBrInstr(pBVar9);
    bVar2 = IR::MultiBranchInstr::ReplaceTarget(this_04,pLVar8,this_03);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x8cd,"(replaced)","replaced");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    pLVar10 = IR::BranchInstr::GetTarget(pBVar9);
    if (pLVar10 == pLVar8) {
      IR::BranchInstr::SetTarget(pBVar9,this_03);
    }
  }
  bVar2 = IR::Instr::IsBranchInstr(pIVar7);
  if (bVar2) {
    pBVar9 = IR::Instr::AsBranchInstr(pIVar7);
    bVar2 = IR::Instr::HasFallThrough(&pBVar9->super_Instr);
    if (!bVar2) goto LAB_00537de3;
  }
  if (((*(ushort *)&pBVar6->field_0x18 & 1) == 0) &&
     (pFVar11 = FindEdge(this,pBVar6,block), pFVar11 != (FlowEdge *)0x0)) {
    pBVar3 = InsertCompensationCodeForBlockMove(this,pFVar11,true,true,afterForward);
    BasicBlock::IncrementDataUseCount(pBVar3);
    *(ushort *)&pBVar3->field_0x18 = *(ushort *)&pBVar3->field_0x18 & 0xffbf | 0x40;
  }
LAB_00537de3:
  Dump(this,true,L"\n After insertion of airlock block \n");
  return this_00;
}

Assistant:

BasicBlock *
FlowGraph::InsertAirlockBlock(FlowEdge * edge, bool afterForward /*= false*/)
{
    BasicBlock * airlockBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();

    IR::Instr * sourceLastInstr = sourceBlock->GetLastInstr();

    //
    // Normalize block
    //
    if(!sourceLastInstr->IsBranchInstr())
    {
        // There are some cases where the last instruction of a block can be not a branch;
        // for example, if it was previously a conditional branch that was impossible to take.
        // In these situations, we can insert an unconditional branch to fallthrough for that
        // block, to renormalize it.
        SListBaseCounted<FlowEdge*>* successors = sourceBlock->GetSuccList();
        // Only handling the case for one arc left at the moment; other cases are likely bugs.
        AssertOrFailFastMsg(successors->HasOne(), "Failed to normalize weird block before airlock");
        FlowEdge* onlyLink = successors->Head();
        AssertOrFailFastMsg(onlyLink == edge, "Found duplicate of edge?");
        AssertOrFailFastMsg(onlyLink->GetSucc() == sinkBlock, "State inconsistent");
        sourceLastInstr->InsertAfter(IR::BranchInstr::New(Js::OpCode::Br, onlyLink->GetSucc()->GetFirstInstr()->AsLabelInstr(), sourceLastInstr->m_func));
        sourceLastInstr = sourceLastInstr->m_next;
    }

    BasicBlock * sinkPrevBlock = sinkBlock->prev;
    IR::Instr *  sinkPrevBlockLastInstr = sinkPrevBlock->GetLastInstr();

    airlockBlock->loop = sinkBlock->loop;
    airlockBlock->SetBlockNum(this->blockCount++);
#ifdef DBG
    airlockBlock->isAirLockBlock = true;
#endif

    //
    // Fixup block linkage
    //

    // airlock block is inserted right before sourceBlock
    airlockBlock->prev = sinkBlock->prev;
    sinkBlock->prev = airlockBlock;

    airlockBlock->next = sinkBlock;
    airlockBlock->prev->next = airlockBlock;

    //
    // Fixup flow edges
    //

    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, airlockBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(airlockBlock);
    airlockBlock->AddSucc(edge, this);

    // Fixup data use count
    airlockBlock->SetDataUseCount(1);
    sourceBlock->DecrementDataUseCount();

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *airlockLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);

    sinkPrevBlockLastInstr->InsertAfter(airlockLabel);

    airlockBlock->SetFirstInstr(airlockLabel);
    airlockLabel->SetBasicBlock(airlockBlock);

    // Add br to sinkBlock from airlock block
    IR::BranchInstr *airlockBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    airlockBr->SetByteCodeOffset(sinkLabel);
    airlockLabel->InsertAfter(airlockBr);
    airlockBlock->SetLastInstr(airlockBr);

    airlockLabel->SetByteCodeOffset(sinkLabel);

    // If we have regions in play, we should update them on the airlock block appropriately
    if (afterForward)
    {
        airlockLabel->SetRegion(sinkLabel->GetRegion());
    }

    // Fixup flow out of sourceBlock
    IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
    if (sourceBr->IsMultiBranch())
    {
        const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, airlockLabel);
        Assert(replaced);
    }
    else if (sourceBr->GetTarget() == sinkLabel)
    {
        sourceBr->SetTarget(airlockLabel);
    }

    if (!sinkPrevBlockLastInstr->IsBranchInstr() || sinkPrevBlockLastInstr->AsBranchInstr()->HasFallThrough())
    {
        if (!sinkPrevBlock->isDeleted)
        {
            FlowEdge *dstEdge = this->FindEdge(sinkPrevBlock, sinkBlock);
            if (dstEdge) // Possibility that sourceblock may be same as sinkPrevBlock
            {
                BasicBlock* compensationBlock = this->InsertCompensationCodeForBlockMove(dstEdge, true /*insert comp block to loop list*/, true, afterForward);
                compensationBlock->IncrementDataUseCount();
                // We need to skip airlock compensation block in globopt as its inserted while globopt is iteration over the blocks.
                compensationBlock->isAirLockCompensationBlock = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After insertion of airlock block \n"));
#endif

    return airlockBlock;
}